

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

void timer_read(void *context,cio_epoll_error error)

{
  uint64_t in_RAX;
  ssize_t sVar1;
  code *UNRECOVERED_JUMPTABLE;
  int *piVar2;
  cio_error cVar3;
  undefined8 uVar4;
  uint64_t number_of_expirations;
  
  if (error == CIO_EPOLL_SUCCESS) {
    number_of_expirations = 0;
    sVar1 = read(*(int *)((long)context + 0x30),&number_of_expirations,8);
    if (sVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 == 0xb) {
        return;
      }
      UNRECOVERED_JUMPTABLE = *(code **)((long)context + 8);
      uVar4 = *(undefined8 *)((long)context + 0x10);
      cVar3 = -*piVar2;
    }
    else {
      UNRECOVERED_JUMPTABLE = *(code **)((long)context + 8);
      uVar4 = *(undefined8 *)((long)context + 0x10);
      *(undefined8 *)((long)context + 8) = 0;
      cVar3 = CIO_SUCCESS;
    }
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)((long)context + 8);
    *(undefined8 *)((long)context + 8) = 0;
    number_of_expirations = in_RAX;
    cVar3 = cio_linux_get_socket_error(*(int *)((long)context + 0x30));
    uVar4 = *(undefined8 *)((long)context + 0x10);
  }
  (*UNRECOVERED_JUMPTABLE)(context,uVar4,cVar3);
  return;
}

Assistant:

static void timer_read(void *context, enum cio_epoll_error error)
{
	struct cio_timer *timer = context;

	if (cio_unlikely(error != CIO_EPOLL_SUCCESS)) {
		cio_timer_handler_t handler = timer->handler;
		timer->handler = NULL;
		enum cio_error err = cio_linux_get_socket_error(timer->impl.ev.fd);
		handler(timer, timer->handler_context, err);
		return;
	}

	uint64_t number_of_expirations = 0;

	ssize_t ret = read(timer->impl.ev.fd, &number_of_expirations, sizeof(number_of_expirations));
	if (cio_unlikely(ret == -1)) {
		if (cio_unlikely(errno != EAGAIN)) {
			timer->handler(timer, timer->handler_context, (enum cio_error)(-errno));
		}
	} else {
		cio_timer_handler_t handler = timer->handler;
		timer->handler = NULL;
		handler(timer, timer->handler_context, CIO_SUCCESS);
	}
}